

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

QEventPoint * __thiscall QTest::QTouchEventSequence::point(QTouchEventSequence *this,int touchId)

{
  QExplicitlySharedDataPointer<QEventPointPrivate> QVar1;
  bool bVar2;
  QEventPoint *pQVar3;
  QMap<int,_QEventPoint> *this_00;
  long in_FS_OFFSET;
  QEventPoint local_30;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->points;
  local_24 = touchId;
  bVar2 = QMap<int,_QEventPoint>::contains(this_00,&local_24);
  if (!bVar2) {
    QEventPoint::QEventPoint(&local_30,local_24,(QPointingDevice *)0x0);
    pQVar3 = QMap<int,_QEventPoint>::operator[](this_00,&local_24);
    QVar1.d.ptr = (totally_ordered_wrapper<QEventPointPrivate_*>)(pQVar3->d).d.ptr;
    (pQVar3->d).d.ptr = (QEventPointPrivate *)local_30.d.d.ptr;
    local_30.d.d.ptr =
         (QExplicitlySharedDataPointer<QEventPointPrivate>)
         (QExplicitlySharedDataPointer<QEventPointPrivate>)QVar1.d.ptr;
    QEventPoint::~QEventPoint(&local_30);
  }
  pQVar3 = QMap<int,_QEventPoint>::operator[](this_00,&local_24);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QEventPoint &QTouchEventSequence::point(int touchId)
{
    if (!points.contains(touchId))
        points[touchId] = QEventPoint(touchId);
    return points[touchId];
}